

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_solve_seq.c
# Opt level: O1

void pnga_lu_solve_seq(char *trans,Integer g_a,Integer g_b)

{
  Integer IVar1;
  void *ptr;
  void *buf;
  void *ptr_00;
  long lVar2;
  Integer IVar3;
  char *pcVar4;
  Integer dimB1;
  Integer dimA1;
  long info;
  Integer local_d0;
  void *local_c8;
  void *local_c0;
  void *local_b8;
  long local_b0;
  char *local_a8;
  long blas_dimB2;
  long blas_dimB1;
  long blas_dimA1;
  Integer typeB;
  Integer typeA;
  Integer hi [2];
  Integer lo [2];
  Integer ndim;
  long blas_dimA2;
  Integer dims [2];
  
  info = 0;
  local_a8 = trans;
  IVar3 = pnga_nodeid();
  pnga_check_handle(g_a,"ga_lu_solve: a");
  pnga_check_handle(g_b,"ga_lu_solve: b");
  pnga_inquire(g_a,&typeA,&ndim,dims);
  IVar1 = dims[1];
  dimA1 = dims[0];
  pnga_inquire(g_b,&typeB,&ndim,dims);
  dimB1 = dims[0];
  if (dimA1 == IVar1) {
    if (dimA1 != dims[0]) {
      pcVar4 = "ga_lu_solve: dims of A and B do not match ";
      goto LAB_001980ff;
    }
    pcVar4 = "ga_lu_solve: wrong type(s) of A and/or B ";
    if ((typeA != 0x3ec) || (typeB != 0x3ec)) goto LAB_001980ff;
  }
  else {
    pcVar4 = "ga_lu_solve: g_a must be square matrix ";
LAB_001980ff:
    pnga_error(pcVar4,1);
  }
  pnga_sync();
  if (IVar3 != 0) goto LAB_001982b6;
  local_b8 = pnga_malloc(dimA1 * IVar1,0x3f5,"a");
  local_c0 = pnga_malloc(dimB1 * dims[1],0x3f5,"b");
  IVar3 = dimA1;
  if (IVar1 <= dimA1) {
    IVar3 = IVar1;
  }
  local_c8 = pnga_malloc(IVar3,0x3f2,"ipiv");
  ptr_00 = local_b8;
  local_b0 = dims[1];
  lo[0] = 1;
  hi[0] = dimA1;
  lo[1] = 1;
  hi[1] = IVar1;
  pnga_get(g_a,lo,hi,local_b8,&dimA1);
  lVar2 = local_b0;
  buf = local_c0;
  ptr = local_c8;
  lo[0] = 1;
  hi[0] = dimB1;
  lo[1] = 1;
  hi[1] = local_b0;
  local_d0 = g_b;
  pnga_get(g_b,lo,hi,local_c0,&dimB1);
  blas_dimA1 = dimA1;
  blas_dimA2 = IVar1;
  blas_dimB1 = dimB1;
  blas_dimB2 = lVar2;
  gal_dgetrf_(&blas_dimA1,&blas_dimA2,ptr_00,&blas_dimA1,ptr,&info);
  IVar1 = local_d0;
  if (info == 0) {
    gal_dgetrs_(local_a8,&blas_dimA1,&blas_dimB2,ptr_00,&blas_dimA1,ptr,buf,&blas_dimB1,&info,1);
    if (info != 0) {
      pcVar4 = " ga_lu_solve: LP_dgesl failed ";
      goto LAB_00198299;
    }
    lo[0] = 1;
    hi[0] = dimB1;
    lo[1] = 1;
    hi[1] = lVar2;
    pnga_put(IVar1,lo,hi,buf,&dimB1);
  }
  else {
    pcVar4 = " ga_lu_solve: LP_dgefa failed ";
LAB_00198299:
    pnga_error(pcVar4,-info);
  }
  pnga_free(ptr);
  pnga_free(buf);
  pnga_free(ptr_00);
LAB_001982b6:
  pnga_sync();
  return;
}

Assistant:

void pnga_lu_solve_seq(char *trans, Integer g_a, Integer g_b) {

  logical oactive;  /* true iff this process participates */
  Integer dimA1, dimA2, typeA;
  Integer dimB1, dimB2, typeB;
  Integer me;
#if HAVE_LAPACK || ENABLE_F77
  BlasInt blas_dimA1, blas_dimA2, blas_dimB1, blas_dimB2, info=0;
#else
  Integer info=0;
#endif
  Integer dims[2], ndim;
  Integer lo[2], hi[2];

  /** check environment */
  me     = pnga_nodeid();
  
  /** check GA info for input arrays */
  pnga_check_handle(g_a, "ga_lu_solve: a");
  pnga_check_handle(g_b, "ga_lu_solve: b");
  pnga_inquire(g_a, &typeA, &ndim, dims);
  dimA1 = dims[0];
  dimA2 = dims[1];
  pnga_inquire(g_b, &typeB, &ndim, dims);
  dimB1 = dims[0];
  dimB2 = dims[1];
  

  if (dimA1 != dimA2) 
    pnga_error("ga_lu_solve: g_a must be square matrix ", 1);
  else if(dimA1 != dimB1) 
    pnga_error("ga_lu_solve: dims of A and B do not match ", 1);
  else if(typeA != C_DBL || typeB != C_DBL) 
    pnga_error("ga_lu_solve: wrong type(s) of A and/or B ", 1);
  
  pnga_sync();
  oactive = (me == 0);

  if (oactive) {
    DoublePrecision *adra, *adrb;
    Integer *adri;
    Integer one=1; 

    /** allocate a,b, and work and ipiv arrays */
    adra = (DoublePrecision*) pnga_malloc(dimA1*dimA2, F_DBL, "a");
    adrb = (DoublePrecision*) pnga_malloc(dimB1*dimB2, F_DBL, "b");
    adri = (Integer*) pnga_malloc(GA_MIN(dimA1,dimA2), F_INT, "ipiv");

    /** Fill local arrays from global arrays */   
    lo[0] = one;
    hi[0] = dimA1;
    lo[1] = one;
    hi[1] = dimA2;
    pnga_get(g_a, lo, hi, adra, &dimA1);
    lo[0] = one;
    hi[0] = dimB1;
    lo[1] = one;
    hi[1] = dimB2;
    pnga_get(g_b, lo, hi, adrb, &dimB1);

    /** LU factorization */
#if HAVE_LAPACK || ENABLE_F77
    blas_dimA1 = dimA1;
    blas_dimA2 = dimA2;
    blas_dimB1 = dimB1;
    blas_dimB2 = dimB2;
    LAPACK_DGETRF(&blas_dimA1, &blas_dimA2, adra, &blas_dimA1, (BlasInt*)adri, &info);
#else
    {  int info_t;
      LP_dgefa(adra, (int)dimA1, (int)dimA2, (int*)adri, &info_t);
      info = info_t;
    }
#endif

    /** SOLVE */
    if(info == 0) {
#if HAVE_LAPACK || ENABLE_F77
      LAPACK_DGETRS(trans, &blas_dimA1, &blas_dimB2, adra, &blas_dimA1, 
          (BlasInt*)adri, adrb, &blas_dimB1, &info);
#else
      DoublePrecision *p_b;
      Integer i;
      int job=0;
      if(*trans == 't' || *trans == 'T') job = 1; 
      for(i=0; i<dimB2; i++) {
        p_b = adrb + i*dimB1;
        LP_dgesl(adra, (int)dimA1, (int)dimA2, (int*)adri, p_b, job);
      }
#endif

      if(info == 0) {
        lo[0] = one;
        hi[0] = dimB1;
        lo[1] = one;
        hi[1] = dimB2;
        pnga_put(g_b, lo, hi, adrb, &dimB1);
      } else
        pnga_error(" ga_lu_solve: LP_dgesl failed ", -info);

    }
    else
      pnga_error(" ga_lu_solve: LP_dgefa failed ", -info);

    /** deallocate work arrays */
    pnga_free(adri);
    pnga_free(adrb);
    pnga_free(adra);
  }

  pnga_sync();
  
}